

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O0

Result Kernel::poCompToResult(PoComp c)

{
  Result RVar1;
  PoComp c_local;
  
  RVar1 = (*(code *)(&DAT_00efac48 + *(int *)(&DAT_00efac48 + (ulong)c * 4)))();
  return RVar1;
}

Assistant:

Result poCompToResult(PoComp c) {
  switch (c) {
    case PoComp::GREATER:
      return Result::GREATER;
    case PoComp::EQUAL:
      return Result::EQUAL;
    case PoComp::LESS:
      return Result::LESS;
    case PoComp::NGEQ:
    case PoComp::NLEQ:
    case PoComp::INCOMPARABLE:
      return Result::INCOMPARABLE;
    case PoComp::UNKNOWN:
      // no unknowns here
      ASSERTION_VIOLATION;
  }
  ASSERTION_VIOLATION;
}